

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int add_shape_property(JSContext *ctx,JSShape **psh,JSObject *p,JSAtom atom,int prop_flags)

{
  JSRuntime *pJVar1;
  JSShape *pJVar2;
  JSShape **ppJVar3;
  JSAtomStruct *pJVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  JSShape **ppJVar8;
  JSShape *pJVar9;
  uint uVar10;
  
  pJVar1 = ctx->rt;
  pJVar9 = *psh;
  if (pJVar9->is_hashed == '\0') {
    uVar10 = 0;
  }
  else {
    uVar10 = pJVar9->hash;
    ppJVar3 = pJVar1->shape_hash + (uVar10 >> (-(char)pJVar1->shape_hash_bits & 0x1fU));
    do {
      ppJVar8 = ppJVar3;
      pJVar2 = *ppJVar8;
      ppJVar3 = &pJVar2->shape_hash_next;
    } while (pJVar2 != pJVar9);
    *ppJVar8 = pJVar9->shape_hash_next;
    pJVar1->shape_hash_count = pJVar1->shape_hash_count + -1;
    uVar10 = ((uVar10 + atom) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
  }
  if (pJVar9->prop_size <= pJVar9->prop_count) {
    iVar5 = resize_properties(ctx,psh,p,pJVar9->prop_count + 1);
    if (iVar5 != 0) {
      if (pJVar9->is_hashed == '\0') {
        return -1;
      }
      uVar10 = pJVar9->hash >> (-(char)pJVar1->shape_hash_bits & 0x1fU);
      ppJVar3 = pJVar1->shape_hash;
      pJVar9->shape_hash_next = ppJVar3[uVar10];
      ppJVar3[uVar10] = pJVar9;
      pJVar1->shape_hash_count = pJVar1->shape_hash_count + 1;
      return -1;
    }
    pJVar9 = *psh;
  }
  if (pJVar9->is_hashed != '\0') {
    pJVar9->hash = uVar10;
    uVar10 = uVar10 >> (-(char)pJVar1->shape_hash_bits & 0x1fU);
    ppJVar3 = pJVar1->shape_hash;
    pJVar9->shape_hash_next = ppJVar3[uVar10];
    ppJVar3[uVar10] = pJVar9;
    pJVar1->shape_hash_count = pJVar1->shape_hash_count + 1;
  }
  lVar6 = (long)pJVar9->prop_count;
  pJVar9->prop_count = pJVar9->prop_count + 1;
  if (0xd1 < (int)atom) {
    pJVar4 = ctx->rt->atom_array[atom];
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
  }
  *(JSAtom *)(&pJVar9[1].header.field_0x4 + lVar6 * 8) = atom;
  (&pJVar9[1].header.ref_count)[lVar6 * 2] =
       (&pJVar9[1].header.ref_count)[lVar6 * 2] & 0x3ffffffU | prop_flags << 0x1a;
  pJVar9->has_small_array_index = pJVar9->has_small_array_index | (byte)(atom >> 0x1f);
  uVar7 = ~(ulong)(atom & pJVar9->prop_hash_mask);
  (&pJVar9[1].header.ref_count)[lVar6 * 2] =
       (&pJVar9[1].header.ref_count)[lVar6 * 2] & 0xfc000000U |
       (&(pJVar9->header).ref_count)[uVar7] & 0x3ffffffU;
  (&(pJVar9->header).ref_count)[uVar7] = pJVar9->prop_count;
  return 0;
}

Assistant:

static int add_shape_property(JSContext *ctx, JSShape **psh,
                              JSObject *p, JSAtom atom, int prop_flags)
{
    JSRuntime *rt = ctx->rt;
    JSShape *sh = *psh;
    JSShapeProperty *pr, *prop;
    uint32_t hash_mask, new_shape_hash = 0;
    intptr_t h;

    /* update the shape hash */
    if (sh->is_hashed) {
        js_shape_hash_unlink(rt, sh);
        new_shape_hash = shape_hash(shape_hash(sh->hash, atom), prop_flags);
    }

    if (unlikely(sh->prop_count >= sh->prop_size)) {
        if (resize_properties(ctx, psh, p, sh->prop_count + 1)) {
            /* in case of error, reinsert in the hash table.
               sh is still valid if resize_properties() failed */
            if (sh->is_hashed)
                js_shape_hash_link(rt, sh);
            return -1;
        }
        sh = *psh;
    }
    if (sh->is_hashed) {
        sh->hash = new_shape_hash;
        js_shape_hash_link(rt, sh);
    }
    /* Initialize the new shape property.
       The object property at p->prop[sh->prop_count] is uninitialized */
    prop = get_shape_prop(sh);
    pr = &prop[sh->prop_count++];
    pr->atom = JS_DupAtom(ctx, atom);
    pr->flags = prop_flags;
    sh->has_small_array_index |= __JS_AtomIsTaggedInt(atom);
    /* add in hash table */
    hash_mask = sh->prop_hash_mask;
    h = atom & hash_mask;
    pr->hash_next = prop_hash_end(sh)[-h - 1];
    prop_hash_end(sh)[-h - 1] = sh->prop_count;
    return 0;
}